

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int fetch_escaped_value_raw(OnigUChar **src,OnigUChar *end,ParseEnv *env,OnigCodePoint *val)

{
  OnigEncoding pOVar1;
  OnigCodePoint OVar2;
  int iVar3;
  OnigUChar *pOVar4;
  OnigCodePoint c;
  OnigUChar *p;
  OnigCodePoint local_4c;
  OnigUChar *local_48;
  OnigUChar **local_40;
  uint *local_38;
  
  pOVar1 = env->enc;
  pOVar4 = *src;
  if (end <= pOVar4) {
    return -0x68;
  }
  local_48 = pOVar4;
  local_40 = src;
  local_38 = val;
  OVar2 = (*pOVar1->mbc_to_code)(pOVar4,end);
  local_4c = OVar2;
  iVar3 = (*pOVar1->mbc_enc_len)(pOVar4);
  pOVar4 = pOVar4 + iVar3;
  local_48 = pOVar4;
  if (OVar2 == 0x43) {
    if ((env->syntax->op2 & 0x800) != 0) {
      if (end <= pOVar4) {
        return -0x6a;
      }
      OVar2 = (*pOVar1->mbc_to_code)(pOVar4,end);
      local_4c = OVar2;
      iVar3 = (*pOVar1->mbc_enc_len)(pOVar4);
      local_48 = pOVar4 + iVar3;
      if (OVar2 != 0x2d) {
        return -0x6d;
      }
LAB_00113934:
      pOVar4 = local_48;
      if (end <= local_48) {
        return -0x6a;
      }
      OVar2 = (*pOVar1->mbc_to_code)(local_48,end);
      local_4c = OVar2;
      iVar3 = (*pOVar1->mbc_enc_len)(pOVar4);
      local_48 = pOVar4 + iVar3;
      if (OVar2 == 0x3f) {
        local_4c = 0x7f;
      }
      else {
        if ((OVar2 == (env->syntax->meta_char_table).esc) &&
           (iVar3 = fetch_escaped_value_raw(&local_48,end,env,&local_4c), iVar3 < 0)) {
          return iVar3;
        }
        local_4c = local_4c & 0x9f;
      }
      goto LAB_0011399e;
    }
  }
  else if (OVar2 == 99) {
    if ((env->syntax->op & 0x8000000) != 0) goto LAB_00113934;
  }
  else if ((OVar2 == 0x4d) && ((env->syntax->op2 & 0x1000) != 0)) {
    if (end <= pOVar4) {
      return -0x69;
    }
    OVar2 = (*pOVar1->mbc_to_code)(pOVar4,end);
    local_4c = OVar2;
    iVar3 = (*pOVar1->mbc_enc_len)(pOVar4);
    pOVar4 = pOVar4 + iVar3;
    if (OVar2 != 0x2d) {
      return -0x6c;
    }
    if (end <= pOVar4) {
      return -0x69;
    }
    local_48 = pOVar4;
    OVar2 = (*pOVar1->mbc_to_code)(pOVar4,end);
    local_4c = OVar2;
    iVar3 = (*pOVar1->mbc_enc_len)(pOVar4);
    local_48 = pOVar4 + iVar3;
    if ((OVar2 == (env->syntax->meta_char_table).esc) &&
       (iVar3 = fetch_escaped_value_raw(&local_48,end,env,&local_4c), iVar3 < 0)) {
      return iVar3;
    }
    local_4c = local_4c & 0xff | 0x80;
    goto LAB_0011399e;
  }
  if ((env->syntax->op & 0x4000000) == 0) goto switchD_001139dd_caseD_6f;
  switch(OVar2) {
  case 0x61:
    local_4c = 7;
    break;
  case 0x62:
    local_4c = 8;
    break;
  case 99:
  case 100:
    goto switchD_001139dd_caseD_6f;
  case 0x65:
    local_4c = 0x1b;
    break;
  case 0x66:
    local_4c = 0xc;
    break;
  default:
    switch(OVar2) {
    case 0x6e:
      local_4c = 10;
      break;
    case 0x72:
      local_4c = 0xd;
      break;
    case 0x74:
      local_4c = 9;
      break;
    case 0x76:
      local_4c = 0xb;
      if ((env->syntax->op2 & 0x2000) != 0) break;
    default:
switchD_001139dd_caseD_6f:
      local_4c = OVar2;
    }
  }
LAB_0011399e:
  *local_40 = local_48;
  *local_38 = local_4c;
  return 0;
}

Assistant:

static int
fetch_escaped_value_raw(UChar** src, UChar* end, ParseEnv* env,
                        OnigCodePoint* val)
{
  int v;
  OnigCodePoint c;
  OnigEncoding enc = env->enc;
  UChar* p = *src;

  if (PEND) return ONIGERR_END_PATTERN_AT_ESCAPE;

  PFETCH_S(c);
  switch (c) {
  case 'M':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_M_BAR_META)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_META_CODE_SYNTAX;
      if (PEND) return ONIGERR_END_PATTERN_AT_META;
      PFETCH_S(c);
      if (c == MC_ESC(env->syntax)) {
        v = fetch_escaped_value_raw(&p, end, env, &c);
        if (v < 0) return v;
      }
      c = ((c & 0xff) | 0x80);
    }
    else
      goto backslash;
    break;

  case 'C':
    if (IS_SYNTAX_OP2(env->syntax, ONIG_SYN_OP2_ESC_CAPITAL_C_BAR_CONTROL)) {
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c != '-') return ONIGERR_CONTROL_CODE_SYNTAX;
      goto control;
    }
    else
      goto backslash;

  case 'c':
    if (IS_SYNTAX_OP(env->syntax, ONIG_SYN_OP_ESC_C_CONTROL)) {
    control:
      if (PEND) return ONIGERR_END_PATTERN_AT_CONTROL;
      PFETCH_S(c);
      if (c == '?') {
        c = 0177;
      }
      else {
        if (c == MC_ESC(env->syntax)) {
          v = fetch_escaped_value_raw(&p, end, env, &c);
          if (v < 0) return v;
        }
        c &= 0x9f;
      }
      break;
    }
    /* fall through */

  default:
    {
    backslash:
      c = conv_backslash_value(c, env);
    }
    break;
  }

  *src = p;
  *val = c;
  return 0;
}